

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O0

BOOL IsDBCSLeadByteEx(UINT CodePage,BYTE TestChar)

{
  BOOL BVar1;
  long in_FS_OFFSET;
  BOOL local_3c;
  ulong uStack_38;
  BOOL bRet;
  SIZE_T i;
  undefined1 local_24 [3];
  BYTE TestChar_local;
  UINT CodePage_local;
  CPINFO cpinfo;
  
  cpinfo._12_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  local_3c = 0;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  BVar1 = GetCPInfo(CodePage,(LPCPINFO)local_24);
  if (BVar1 == 0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    SetLastError(0x57);
  }
  else {
    uStack_38 = 0;
    while( true ) {
      if ((0xb < uStack_38) || (cpinfo.DefaultChar[uStack_38 - 6] == '\0')) goto LAB_0014d431;
      if ((cpinfo.DefaultChar[uStack_38 - 6] <= TestChar) &&
         (TestChar <= cpinfo.DefaultChar[uStack_38 - 5])) break;
      uStack_38 = uStack_38 + 2;
    }
    local_3c = 1;
  }
LAB_0014d431:
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != cpinfo._12_8_) {
    __stack_chk_fail();
  }
  return local_3c;
}

Assistant:

BOOL
PALAPI
IsDBCSLeadByteEx(
     IN UINT CodePage,
     IN BYTE TestChar)
{
    CPINFO cpinfo;
    SIZE_T i;
    BOOL bRet = FALSE;

    PERF_ENTRY(IsDBCSLeadByteEx);
    ENTRY("IsDBCSLeadByteEx(CodePage=%#x, TestChar=%d)\n", CodePage, TestChar);

    /* Get the lead byte info with respect to the given codepage*/
    if( !GetCPInfo( CodePage, &cpinfo ) )
    {
        ERROR("Error CodePage(%#x) parameter is invalid\n", CodePage );
        SetLastError( ERROR_INVALID_PARAMETER );
        goto done;
    }

    for( i=0; i < sizeof(cpinfo.LeadByte)/sizeof(cpinfo.LeadByte[0]); i += 2 )
    {
        if( 0 == cpinfo.LeadByte[ i ] )
        {
            goto done;
        }

        /*check if the given char is in one of the lead byte ranges*/
        if( cpinfo.LeadByte[i] <= TestChar && TestChar<= cpinfo.LeadByte[i+1] )
        {
            bRet = TRUE;
            goto done;
        }
    }
done:
    LOGEXIT("IsDBCSLeadByteEx returns BOOL %d\n",bRet);
    PERF_EXIT(IsDBCSLeadByteEx);
    return bRet;
}